

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

float tcu::linearChannelToSRGB(float cl)

{
  float fVar1;
  
  fVar1 = 0.0;
  if (0.0 < cl) {
    if (0.0031308 <= cl) {
      fVar1 = 1.0;
      if (cl < 1.0) {
        fVar1 = powf(cl,0.41666);
        return fVar1 * 1.055 + -0.055;
      }
    }
    else {
      fVar1 = cl * 12.92;
    }
  }
  return fVar1;
}

Assistant:

static inline float linearChannelToSRGB (float cl)
{
	if (cl <= 0.0f)
		return 0.0f;
	else if (cl < 0.0031308f)
		return 12.92f*cl;
	else if (cl < 1.0f)
		return 1.055f*deFloatPow(cl, 0.41666f) - 0.055f;
	else
		return 1.0f;
}